

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O2

int h264_coded_block_pattern
              (bitstream *str,h264_cabac_context *cabac,uint32_t mb_type,int has_chroma,
              uint32_t *val)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  h264_macroblock *phVar4;
  h264_macroblock *phVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t *binVal;
  ulong uVar8;
  long lVar9;
  int (*paiVar10) [2];
  int local_6c;
  undefined1 local_68 [16];
  undefined8 local_58;
  int idxB;
  int idxA;
  int local_44;
  h264_macroblock *local_40;
  uint *local_38;
  
  if (cabac == (h264_cabac_context *)0x0) {
    local_68._0_4_ = 0xffffffff;
    paiVar10 = cbplc;
    if (has_chroma == 0) {
      paiVar10 = cbpl;
    }
    uVar7 = (uint)(has_chroma != 0) << 5 | 0x10;
    if (str->dir == VS_ENCODE) {
      if (uVar7 <= *val) {
        fwrite("coded_block_pattern too large\n",0x1e,1,_stderr);
        return 1;
      }
      uVar6 = 0xffffffffffffffff;
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        if (paiVar10[uVar8][0x1a < mb_type] == *val) {
          uVar6 = uVar8;
        }
        uVar6 = uVar6 & 0xffffffff;
      }
      local_68._0_4_ = (int)uVar6;
    }
    iVar3 = vs_ue(str,(uint32_t *)local_68);
    if (iVar3 != 0) {
      return 1;
    }
    if (str->dir == VS_DECODE) {
      if (uVar7 <= (uint)local_68._0_4_) goto LAB_0010873f;
      *val = paiVar10[(uint)local_68._0_4_][0x1a < mb_type];
    }
    local_6c = 0;
  }
  else {
    local_68 = (undefined1  [16])0x0;
    local_58 = 0;
    local_40 = h264_mb_nb(cabac->slice,H264_MB_THIS,0);
    local_6c = 1;
    h264_mb_nb(cabac->slice,H264_MB_A,0);
    h264_mb_nb(cabac->slice,H264_MB_B,0);
    if (str->dir == VS_ENCODE) {
      uVar7 = *val;
      if (((uint)(has_chroma != 0) << 5 | 0x10) <= uVar7) {
LAB_0010873f:
        fwrite("coded_block_pattern too large\n",0x1e,1,_stderr);
        return 1;
      }
      local_68._0_8_ = CONCAT44(uVar7 >> 1,uVar7) & 0x100000001;
      local_68._8_4_ = uVar7 >> 2 & 1;
      local_68._12_4_ = uVar7 >> 3 & 1;
      local_58 = CONCAT44(-(uint)(-0x7fffffe1 < (int)(uVar7 ^ 0x80000000)) >> 0x1f,
                          -(uint)(-0x7ffffff1 < (int)(uVar7 ^ 0x80000000)) >> 0x1f);
    }
    binVal = (uint32_t *)local_68;
    lVar9 = 0;
    local_44 = has_chroma;
    local_38 = val;
    do {
      puVar1 = local_38;
      if (lVar9 == 4) {
        if (local_44 != 0) {
          phVar4 = h264_mb_nb(cabac->slice,H264_MB_A,0);
          phVar5 = h264_mb_nb(cabac->slice,H264_MB_B,0);
          iVar3 = h264_cabac_decision(str,cabac,
                                      (0xf < phVar4->coded_block_pattern) + 0x4d +
                                      (uint)(0xf < phVar5->coded_block_pattern) * 2,
                                      (uint32_t *)&local_58);
          if (iVar3 != 0) {
            return 1;
          }
          if (((uint32_t)local_58 != 0) &&
             (iVar3 = h264_cabac_decision(str,cabac,
                                          (0x1f < phVar4->coded_block_pattern) + 0x51 +
                                          (uint)(0x1f < phVar5->coded_block_pattern) * 2,
                                          (uint32_t *)((long)&local_58 + 4)), iVar3 != 0)) {
            return 1;
          }
        }
        if (str->dir != VS_DECODE) {
          return 0;
        }
        *puVar1 = (uint32_t)local_58 << (local_58._4_1_ + 4U & 0x1f) |
                  local_68._12_4_ << 3 | local_68._8_4_ << 2 | local_68._4_4_ * 2 | local_68._0_4_;
        return 0;
      }
      phVar4 = h264_mb_nb_b(cabac->slice,H264_MB_A,H264_BLOCK_8X8,0,(int)lVar9,&idxA);
      phVar5 = h264_mb_nb_b(cabac->slice,H264_MB_B,H264_BLOCK_8X8,0,(int)lVar9,&idxB);
      if (phVar4 == local_40) {
        uVar7 = *(uint *)(local_68 + (long)idxA * 4);
      }
      else {
        uVar7 = (uint)((phVar4->coded_block_pattern >> (idxA & 0x1fU) & 1) != 0);
      }
      if (phVar5 == local_40) {
        uVar2 = *(uint *)(local_68 + (long)idxB * 4);
      }
      else {
        uVar2 = (uint)((phVar5->coded_block_pattern >> (idxB & 0x1fU) & 1) != 0);
      }
      iVar3 = h264_cabac_decision(str,cabac,(uVar7 == 0) + 0x49 + (uint)(uVar2 == 0) * 2,binVal);
      lVar9 = lVar9 + 1;
      binVal = binVal + 1;
    } while (iVar3 == 0);
  }
  return local_6c;
}

Assistant:

int h264_coded_block_pattern(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t mb_type, int has_chroma, uint32_t *val) {
	if (!cabac) {
		uint32_t tmp = -1;
		const int (*tab)[2];
		int maxval;
		int which;
		if (has_chroma) {
			tab = cbplc;
			maxval = 48;
		} else {
			tab = cbpl;
			maxval = 16;
		}
		if (mb_type <= H264_MB_TYPE_SI)
			which = 0;
		else
			which = 1;
		if (str->dir == VS_ENCODE) {
			if (*val >= maxval) {
				fprintf(stderr, "coded_block_pattern too large\n");
				return 1;
			}
			int i;
			for (i = 0; i < maxval; i++) {
				if (tab[i][which] == *val)
					tmp = i;
			}
		}
		if (vs_ue(str, &tmp))
			return 1;
		if (str->dir == VS_DECODE) {
			if (tmp >= maxval) {
				fprintf(stderr, "coded_block_pattern too large\n");
				return 1;
			}
			*val = tab[tmp][which];
		}
		return 0;
	} else {
		int i;
		uint32_t bit[6] = { 0 };
		int ctxIdx;
		const struct h264_macroblock *mbT = h264_mb_nb(cabac->slice, H264_MB_THIS, 0);
		const struct h264_macroblock *mbA;
		const struct h264_macroblock *mbB;
		int idxA;
		int idxB;
		mbA = h264_mb_nb(cabac->slice, H264_MB_A, 0);
		mbB = h264_mb_nb(cabac->slice, H264_MB_B, 0);
		if (str->dir == VS_ENCODE) {
			if (*val >= (has_chroma?48:16)) {
				fprintf(stderr, "coded_block_pattern too large\n");
				return 1;
			}
			bit[0] = *val >> 0 & 1;
			bit[1] = *val >> 1 & 1;
			bit[2] = *val >> 2 & 1;
			bit[3] = *val >> 3 & 1;
			bit[4] = *val >> 4 > 0;
			bit[5] = *val >> 4 > 1;
		}
		for (i = 0; i < 4; i++) {
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, 0, i, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, 0, i, &idxB);
			int condTermFlagA = !(mbA == mbT ? bit[idxA] : mbA->coded_block_pattern >> idxA & 1);
			int condTermFlagB = !(mbB == mbT ? bit[idxB] : mbB->coded_block_pattern >> idxB & 1);
			ctxIdx = H264_CABAC_CTXIDX_CODED_BLOCK_PATTERN_LUMA + condTermFlagA + condTermFlagB * 2;
			if (h264_cabac_decision(str, cabac, ctxIdx, &bit[i])) return 1;
		}
		if (has_chroma) {
			mbA = h264_mb_nb(cabac->slice, H264_MB_A, 0);
			mbB = h264_mb_nb(cabac->slice, H264_MB_B, 0);
			int condTermFlagA = (mbA->coded_block_pattern >> 4) > 0;
			int condTermFlagB = (mbB->coded_block_pattern >> 4) > 0;
			ctxIdx = H264_CABAC_CTXIDX_CODED_BLOCK_PATTERN_CHROMA + condTermFlagA + condTermFlagB * 2;
			if (h264_cabac_decision(str, cabac, ctxIdx, &bit[4])) return 1;
			if (bit[4]) {
				int condTermFlagA = (mbA->coded_block_pattern >> 4) > 1;
				int condTermFlagB = (mbB->coded_block_pattern >> 4) > 1;
				ctxIdx = H264_CABAC_CTXIDX_CODED_BLOCK_PATTERN_CHROMA + condTermFlagA + condTermFlagB * 2 + 4;
				if (h264_cabac_decision(str, cabac, ctxIdx, &bit[5])) return 1;
			}
		}
		if (str->dir == VS_DECODE) {
			*val = bit[0] | bit[1] << 1 | bit[2] << 2 | bit[3] << 3 | bit[4] << (4+bit[5]);
		}
		return 0;
	}
}